

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_OStream_Test::TestBody(PrintfTest_OStream_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  char *message;
  pointer message_00;
  ulong uVar5;
  int ret;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  ostringstream os;
  AssertHelper local_418 [3];
  int local_3fc;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_3f8;
  undefined1 local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [15];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_418[0].data_ = (AssertHelperData *)0x205bff;
  local_3c0._16_8_ = 0;
  local_3c0._0_8_ = &PTR_grow_0023bf40;
  local_3c0._24_8_ = 500;
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = "Don\'t %s!";
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = (size_t)&DAT_00000009;
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_3c0;
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char[6]>
       ::TYPES;
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_418;
  local_3c0._8_8_ = local_3a0;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_3f8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._8_8_;
  uVar4 = local_3c0._16_8_;
  do {
    uVar5 = 0x7fffffffffffffff;
    if (uVar4 < 0x7fffffffffffffff) {
      uVar5 = uVar4;
    }
    std::ostream::write((char *)local_1a8,(long)pbVar3);
    uVar1 = local_3c0._16_8_;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(pbVar3->_M_dataplus)._M_p + uVar5);
    uVar4 = uVar4 - uVar5;
  } while (uVar4 != 0);
  local_3c0._0_8_ = &PTR_grow_0023bf40;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._8_8_ !=
      local_3a0) {
    operator_delete((void *)local_3c0._8_8_);
  }
  local_3fc = (int)uVar1;
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&local_3f8,"\"Don\'t panic!\"","os.str()",(char (*) [13])"Don\'t panic!",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if (local_3f8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3c0);
    if ((undefined8 *)
        local_3f8.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_3f8.
                          super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                          .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1fe,message);
    testing::internal::AssertHelper::operator=(local_418,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper(local_418);
    if ((_func_int **)local_3c0._0_8_ != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((_func_int **)local_3c0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_3c0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3f8.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ =
       (char *)CONCAT44(local_3f8.
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                        .parse_context_.format_str_.data_._4_4_,0xc);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3c0,"12","ret",(int *)&local_3f8,&local_3fc);
  if (local_3c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((_Alloc_hider *)local_3c0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ff,message_00);
    testing::internal::AssertHelper::operator=(local_418,(Message *)&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(local_418);
    if ((long *)local_3f8.
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                .parse_context_.format_str_.data_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_3f8.
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                  .parse_context_.format_str_.data_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3f8.
                              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                              .parse_context_.format_str_.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TEST(PrintfTest, OStream) {
  std::ostringstream os;
  int ret = fmt::fprintf(os, "Don't %s!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  EXPECT_EQ(12, ret);
}